

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

bool __thiscall World::PKExcept(World *this,int mapid)

{
  int iVar1;
  mapped_type *pmVar2;
  Map *pMVar3;
  long lVar4;
  _List_iterator<int> _Var5;
  bool bVar6;
  allocator<char> local_b1;
  int mapid_local;
  int local_ac;
  string local_a8;
  list<int,_std::allocator<int>_> except_list;
  key_type local_70;
  key_type local_50;
  
  mapid_local = mapid;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"JailMap",(allocator<char> *)&local_50);
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->config,&local_70);
  iVar1 = util::variant::GetInt(pmVar2);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = true;
  if (iVar1 != mapid) {
    pMVar3 = GetMap(this,(short)mapid);
    if (pMVar3->arena == (Arena *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"PKExcept",&local_b1);
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->config,&local_50);
      util::variant::GetString_abi_cxx11_(&local_a8,pmVar2);
      except_list.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next = (_List_node_base *)&except_list;
      except_list.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
      except_list.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_prev = except_list.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next;
      if ((local_a8._M_string_length != 0) &&
         (local_a8._M_dataplus._M_p[local_a8._M_string_length - 1] != ',')) {
        std::__cxx11::string::push_back((char)&local_a8);
      }
      while( true ) {
        lVar4 = std::__cxx11::string::find((char)&local_a8,0x2c);
        if (lVar4 == -1) break;
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_a8);
        local_ac = util::to_int(&local_70);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back(&except_list,&local_ac);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_50);
      _Var5 = std::__find_if<std::_List_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (except_list.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                         super__List_node_base._M_next,(_List_node_base *)&except_list,&mapid_local)
      ;
      bVar6 = _Var5._M_node != (_List_node_base *)&except_list;
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                ((_List_base<int,_std::allocator<int>_> *)&except_list);
    }
  }
  return bVar6;
}

Assistant:

bool World::PKExcept(int mapid)
{
	if (mapid == static_cast<int>(this->config["JailMap"]))
	{
		return true;
	}

	if (this->GetMap(mapid)->arena)
	{
		return true;
	}

	std::list<int> except_list = PKExceptUnserialize(this->config["PKExcept"]);

	return std::find(except_list.begin(), except_list.end(), mapid) != except_list.end();
}